

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  bool bVar1;
  ulong in_RAX;
  IColourImpl *pIVar2;
  ostream *poVar3;
  Colour colourGuard_1;
  Colour colourGuard;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar1 = isReservedTag(tag);
  if (!bVar1) {
    return;
  }
  uStack_18 = uStack_18 & 0xffffffffffffff;
  pIVar2 = Colour::impl();
  (**(code **)(*(long *)pIVar2 + 0x10))(pIVar2,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Tag name [",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(tag->_M_dataplus)._M_p,tag->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] not allowed.\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Tag names starting with non alpha-numeric characters are reserved\n",0x42);
  Colour::~Colour((Colour *)((long)&uStack_18 + 7));
  uStack_18._0_7_ = (uint7)(uint6)uStack_18;
  pIVar2 = Colour::impl();
  (**(code **)(*(long *)pIVar2 + 0x10))(pIVar2,0x17);
  operator<<((ostream *)&std::cerr,_lineInfo);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  Colour::~Colour((Colour *)((long)&uStack_18 + 6));
  exit(1);
}

Assistant:

inline void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
        if( isReservedTag( tag ) ) {
            {
                Colour colourGuard( Colour::Red );
                std::cerr
                    << "Tag name [" << tag << "] not allowed.\n"
                    << "Tag names starting with non alpha-numeric characters are reserved\n";
            }
            {
                Colour colourGuard( Colour::FileName );
                std::cerr << _lineInfo << std::endl;
            }
            exit(1);
        }
    }